

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O3

void __thiscall sznet::net::Connector::stopInLoop(Connector *this)

{
  EventLoop *this_00;
  bool bVar1;
  sz_sock sockfd;
  
  this_00 = this->m_loop;
  bVar1 = EventLoop::isInLoopThread(this_00);
  if (!bVar1) {
    EventLoop::abortNotInLoopThread(this_00);
  }
  if (this->m_state == kConnecting) {
    this->m_state = kDisconnected;
    sockfd = removeAndResetChannel(this);
    retry(this,sockfd);
    return;
  }
  return;
}

Assistant:

void Connector::stopInLoop()
{
	m_loop->assertInLoopThread();
	if (m_state == kConnecting)
	{
		setState(kDisconnected);
		sockets::sz_sock sockfd = removeAndResetChannel();
		retry(sockfd);
	}
}